

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

int32_t normalize_index(hdr_histogram *h,int32_t index)

{
  int iVar1;
  int local_24;
  int32_t adjustment;
  int32_t normalized_index;
  int32_t index_local;
  hdr_histogram *h_local;
  
  local_24 = 0;
  h_local._4_4_ = index;
  if (h->normalizing_index_offset != 0) {
    iVar1 = index - h->normalizing_index_offset;
    if (iVar1 < 0) {
      local_24 = h->counts_len;
    }
    else if (h->counts_len <= iVar1) {
      local_24 = -h->counts_len;
    }
    h_local._4_4_ = iVar1 + local_24;
  }
  return h_local._4_4_;
}

Assistant:

static int32_t normalize_index(const struct hdr_histogram* h, int32_t index)
{
    int32_t normalized_index;
    int32_t adjustment = 0;
    if (h->normalizing_index_offset == 0)
    {
        return index;
    }

    normalized_index = index - h->normalizing_index_offset;

    if (normalized_index < 0)
    {
        adjustment = h->counts_len;
    }
    else if (normalized_index >= h->counts_len)
    {
        adjustment = -h->counts_len;
    }

    return normalized_index + adjustment;
}